

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileOptionsCommand.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_7c6cc0::TargetCompileOptionsImpl::HandleMissingTarget
          (TargetCompileOptionsImpl *this,string *name)

{
  cmMakefile *this_00;
  cmAlphaNum local_98;
  cmAlphaNum local_68;
  string local_38;
  string *local_18;
  string *name_local;
  TargetCompileOptionsImpl *this_local;
  
  this_00 = (this->super_cmTargetPropCommandBase).Makefile;
  local_18 = name;
  name_local = (string *)this;
  cmAlphaNum::cmAlphaNum(&local_68,"Cannot specify compile options for target \"");
  cmAlphaNum::cmAlphaNum(&local_98,local_18);
  cmStrCat<char[38]>(&local_38,&local_68,&local_98,
                     (char (*) [38])"\" which is not built by this project.");
  cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void HandleMissingTarget(const std::string& name) override
  {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Cannot specify compile options for target \"", name,
               "\" which is not built by this project."));
  }